

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void jpgd::jpeg_decoder::decode_block_ac_refine
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  byte bVar1;
  short sVar2;
  coeff_buf *pcVar3;
  uint8 *puVar4;
  huff_tables *phVar5;
  bool bVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint local_3c;
  
  bVar1 = (byte)pD->m_successive_low;
  uVar11 = 1 << (bVar1 & 0x1f);
  uVar13 = -1 << (bVar1 & 0x1f);
  pcVar3 = pD->m_ac_coeffs[component_id];
  if (((pcVar3->block_num_x <= block_x) || (pcVar3->block_num_y <= block_y)) ||
     (0x3f < pD->m_spectral_end)) {
LAB_001530b4:
    stop_decoding(pD,JPGD_DECODE_ERROR);
  }
  puVar4 = pcVar3->pData;
  lVar7 = (long)(pcVar3->block_num_x * block_y * pcVar3->block_size) +
          (long)(block_x * pcVar3->block_size);
  uVar14 = pD->m_spectral_start;
  iVar9 = pD->m_eob_run;
  if (iVar9 == 0) {
    if (pD->m_spectral_end < (int)uVar14) {
      return;
    }
    do {
      if ((7 < (ulong)(uint)pD->m_comp_ac_tab[component_id]) ||
         (phVar5 = pD->m_pHuff_tabs[(uint)pD->m_comp_ac_tab[component_id]],
         phVar5 == (huff_tables *)0x0)) goto LAB_001530b4;
      uVar15 = (ulong)(int)phVar5->look_up[pD->m_bit_buf >> 0x18];
      if ((long)uVar15 < 0) {
        iVar9 = -8;
        do {
          uVar10 = -(uint)((pD->m_bit_buf >> (iVar9 + 0x1fU & 0x1f) & 1) != 0) - (int)uVar15;
          if (((int)(iVar9 + 0x1fU) < 0) || (0x1ff < uVar10)) goto LAB_001530b4;
          uVar15 = (ulong)phVar5->tree[uVar10];
          iVar9 = iVar9 + -1;
        } while ((int)phVar5->tree[uVar10] < 0);
        uVar10 = -iVar9;
      }
      else {
        if (0xff < phVar5->look_up[pD->m_bit_buf >> 0x18]) {
          __assert_fail("symbol < JPGD_HUFF_CODE_SIZE_MAX_LENGTH",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                        ,0x227,"int jpgd::jpeg_decoder::huff_decode(huff_tables *)");
        }
        uVar10 = (uint)phVar5->code_size[uVar15];
      }
      get_bits_no_markers(pD,uVar10);
      uVar12 = uVar15 >> 4 & 0xfffffff;
      if ((uVar15 & 0xf) == 0) {
        local_3c = 0;
        if ((int)uVar12 != 0xf) {
          iVar9 = 1 << ((byte)uVar12 & 0x1f);
          pD->m_eob_run = iVar9;
          if (0xf < (uint)uVar15) {
            uVar8 = get_bits_no_markers(pD,(int)uVar12);
            iVar9 = uVar8 + pD->m_eob_run;
            pD->m_eob_run = iVar9;
          }
          goto LAB_00152e80;
        }
      }
      else {
        if (((uint)uVar15 & 0xf) != 1) goto LAB_001530b4;
        uVar8 = get_bits_no_markers(pD,1);
        local_3c = uVar11;
        if (uVar8 == 0) {
          local_3c = uVar13;
        }
      }
      do {
        lVar16 = (long)(int)(&g_ZAG)[uVar14 & 0x3f];
        if (*(short *)(puVar4 + lVar16 * 2 + lVar7) == 0) {
          uVar10 = uVar14;
          if ((int)uVar12 < 1) break;
          uVar12 = (ulong)((int)uVar12 - 1);
        }
        else {
          uVar8 = get_bits_no_markers(pD,1);
          if ((uVar8 != 0) &&
             (sVar2 = *(short *)(puVar4 + lVar16 * 2 + lVar7), (uVar11 & (int)sVar2) == 0)) {
            uVar10 = uVar11;
            if (sVar2 < 0) {
              uVar10 = uVar13;
            }
            *(short *)(puVar4 + lVar16 * 2 + lVar7) = (short)uVar10 + sVar2;
          }
        }
        uVar10 = uVar14 + 1;
        bVar6 = (int)uVar14 < pD->m_spectral_end;
        uVar14 = uVar10;
      } while (bVar6);
      if ((local_3c != 0) && ((int)uVar10 < 0x40)) {
        *(short *)(puVar4 + (long)(int)(&g_ZAG)[(int)uVar10] * 2 + lVar7) = (short)local_3c;
      }
      uVar14 = uVar10 + 1;
    } while ((int)uVar10 < pD->m_spectral_end);
    iVar9 = pD->m_eob_run;
  }
LAB_00152e80:
  if (0 < iVar9) {
    if ((int)uVar14 <= pD->m_spectral_end) {
      do {
        lVar16 = (long)(int)(&g_ZAG)[uVar14 & 0x3f];
        if (((*(short *)(puVar4 + lVar16 * 2 + lVar7) != 0) &&
            (uVar8 = get_bits_no_markers(pD,1), uVar8 != 0)) &&
           (sVar2 = *(short *)(puVar4 + lVar16 * 2 + lVar7), (uVar11 & (int)sVar2) == 0)) {
          uVar10 = uVar11;
          if (sVar2 < 0) {
            uVar10 = uVar13;
          }
          *(short *)(puVar4 + lVar16 * 2 + lVar7) = (short)uVar10 + sVar2;
        }
        bVar6 = (int)uVar14 < pD->m_spectral_end;
        uVar14 = uVar14 + 1;
      } while (bVar6);
      iVar9 = pD->m_eob_run;
    }
    pD->m_eob_run = iVar9 + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_refine(jpeg_decoder* pD, int component_id, int block_x, int block_y)
	{
		int s, k, r;

		int p1 = 1 << pD->m_successive_low;

		//int m1 = (-1) << pD->m_successive_low;
		int m1 = static_cast<int>((UINT32_MAX << pD->m_successive_low));

		jpgd_block_coeff_t* p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);
		if (pD->m_spectral_end > 63)
			pD->stop_decoding(JPGD_DECODE_ERROR);

		k = pD->m_spectral_start;

		if (pD->m_eob_run == 0)
		{
			for (; k <= pD->m_spectral_end; k++)
			{
				unsigned int idx = pD->m_comp_ac_tab[component_id];
				if (idx >= JPGD_MAX_HUFF_TABLES)
					pD->stop_decoding(JPGD_DECODE_ERROR);

				s = pD->huff_decode(pD->m_pHuff_tabs[idx]);

				r = s >> 4;
				s &= 15;

				if (s)
				{
					if (s != 1)
						pD->stop_decoding(JPGD_DECODE_ERROR);

					if (pD->get_bits_no_markers(1))
						s = p1;
					else
						s = m1;
				}
				else
				{
					if (r != 15)
					{
						pD->m_eob_run = 1 << r;

						if (r)
							pD->m_eob_run += pD->get_bits_no_markers(r);

						break;
					}
				}

				do
				{
					jpgd_block_coeff_t* this_coef = p + g_ZAG[k & 63];

					if (*this_coef != 0)
					{
						if (pD->get_bits_no_markers(1))
						{
							if ((*this_coef & p1) == 0)
							{
								if (*this_coef >= 0)
									*this_coef = static_cast<jpgd_block_coeff_t>(*this_coef + p1);
								else
									*this_coef = static_cast<jpgd_block_coeff_t>(*this_coef + m1);
							}
						}
					}
					else
					{
						if (--r < 0)
							break;
					}

					k++;

				} while (k <= pD->m_spectral_end);

				if ((s) && (k < 64))
				{
					p[g_ZAG[k]] = static_cast<jpgd_block_coeff_t>(s);
				}
			}
		}

		if (pD->m_eob_run > 0)
		{
			for (; k <= pD->m_spectral_end; k++)
			{
				jpgd_block_coeff_t* this_coef = p + g_ZAG[k & 63]; // logical AND to shut up static code analysis

				if (*this_coef != 0)
				{
					if (pD->get_bits_no_markers(1))
					{
						if ((*this_coef & p1) == 0)
						{
							if (*this_coef >= 0)
								*this_coef = static_cast<jpgd_block_coeff_t>(*this_coef + p1);
							else
								*this_coef = static_cast<jpgd_block_coeff_t>(*this_coef + m1);
						}
					}
				}
			}

			pD->m_eob_run--;
		}
	}